

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::TextTreeRenderer::RenderTopLayer
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  TextTreeRenderer *pTVar1;
  bool bVar2;
  bool bVar3;
  char **ppcVar4;
  ulong x;
  ulong x_00;
  allocator local_99;
  ostream *local_98;
  TextTreeRenderer *local_90;
  char **local_88;
  char **local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_80 = &(this->config).HORIZONTAL;
  local_88 = &(this->config).DMIDDLE;
  local_98 = ss;
  local_90 = this;
  for (x_00 = 0;
      (x_00 < root->width &&
      ((this->config).node_render_width * x_00 < (this->config).maximum_render_width));
      x_00 = x_00 + 1) {
    bVar2 = RenderTree::HasNode(root,x_00,y);
    if (bVar2) {
      local_78 = x_00;
      ::std::operator<<(ss,(this->config).LTCORNER);
      ::std::__cxx11::string::string((string *)&local_70,(this->config).HORIZONTAL,&local_99);
      StringUtil::Repeat(&local_50,&local_70,((this->config).node_render_width >> 1) - 1);
      ::std::operator<<(ss,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      ppcVar4 = local_88;
      if (y == 0) {
        ppcVar4 = local_80;
      }
      ::std::operator<<(ss,*ppcVar4);
      pTVar1 = local_90;
      ::std::__cxx11::string::string((string *)&local_70,(local_90->config).HORIZONTAL,&local_99);
      StringUtil::Repeat(&local_50,&local_70,((pTVar1->config).node_render_width >> 1) - 1);
      ::std::operator<<(ss,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      this = local_90;
      ::std::operator<<(ss,(local_90->config).RTCORNER);
      x_00 = local_78;
    }
    else {
      bVar2 = false;
      for (x = x_00; x < root->width; x = x + 1) {
        bVar3 = true;
        if (bVar2 == false) {
          bVar3 = RenderTree::HasNode(root,x,y);
        }
        bVar2 = bVar3;
      }
      ss = local_98;
      if (bVar2 != false) {
        ::std::__cxx11::string::string((string *)&local_70," ",&local_99);
        StringUtil::Repeat(&local_50,&local_70,(this->config).node_render_width);
        ::std::operator<<(local_98,(string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
        ss = local_98;
      }
    }
  }
  ::std::operator<<(ss,'\n');
  return;
}

Assistant:

void TextTreeRenderer::RenderTopLayer(RenderTree &root, std::ostream &ss, idx_t y) {
	for (idx_t x = 0; x < root.width; x++) {
		if (x * config.node_render_width >= config.maximum_render_width) {
			break;
		}
		if (root.HasNode(x, y)) {
			ss << config.LTCORNER;
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			if (y == 0) {
				// top level node: no node above this one
				ss << config.HORIZONTAL;
			} else {
				// render connection to node above this one
				ss << config.DMIDDLE;
			}
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			ss << config.RTCORNER;
		} else {
			bool has_adjacent_nodes = false;
			for (idx_t i = 0; x + i < root.width; i++) {
				has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
			}
			if (!has_adjacent_nodes) {
				// There are no nodes to the right side of this position
				// no need to fill the empty space
				continue;
			}
			// there are nodes next to this, fill the space
			ss << StringUtil::Repeat(" ", config.node_render_width);
		}
	}
	ss << '\n';
}